

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
::lexer(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::input_stream_adapter>
        *this,input_stream_adapter *adapter,bool ignore_comments_)

{
  streambuf *psVar1;
  char cVar2;
  
  psVar1 = adapter->sb;
  (this->ia).is = adapter->is;
  (this->ia).sb = psVar1;
  adapter->is = (istream *)0x0;
  adapter->sb = (streambuf *)0x0;
  this->ignore_comments = ignore_comments_;
  this->current = -1;
  this->next_unget = false;
  (this->position).chars_read_total = 0;
  (this->position).chars_read_current_line = 0;
  (this->position).lines_read = 0;
  (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->token_string).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->token_buffer)._M_dataplus._M_p = (pointer)&(this->token_buffer).field_2;
  (this->token_buffer)._M_string_length = 0;
  (this->token_buffer).field_2._M_local_buf[0] = '\0';
  this->error_message = "";
  this->value_integer = 0;
  this->value_unsigned = 0;
  this->value_float = 0.0;
  cVar2 = get_decimal_point();
  this->decimal_point_char = (int)cVar2;
  return;
}

Assistant:

explicit lexer(InputAdapterType&& adapter, bool ignore_comments_ = false) noexcept
        : ia(std::move(adapter))
        , ignore_comments(ignore_comments_)
        , decimal_point_char(static_cast<char_int_type>(get_decimal_point()))
    {}